

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4ebe96::BNTest_BadModulus_Test::TestBody(BNTest_BadModulus_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Head_base<0UL,_bignum_st_*,_false> _Var2;
  _Head_base<0UL,_bignum_st_*,_false> dv;
  int iVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  BN_MONT_CTX *pBVar6;
  pointer *__ptr_5;
  char *in_R9;
  char *pcVar7;
  pointer *__ptr;
  bool bVar8;
  UniquePtr<BN_MONT_CTX> mont;
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> zero;
  UniquePtr<BIGNUM> b;
  UniquePtr<BIGNUM> a;
  AssertHelper local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  AssertHelper local_58;
  string local_50;
  _Head_base<0UL,_bignum_st_*,_false> local_30;
  _Head_base<0UL,_bignum_st_*,_false> local_28;
  _Head_base<0UL,_bignum_st_*,_false> local_20;
  
  local_20._M_head_impl = (bignum_st *)BN_new();
  local_28._M_head_impl = (bignum_st *)BN_new();
  local_30._M_head_impl = (bignum_st *)BN_new();
  local_68[0] = (internal)((BIGNUM *)local_20._M_head_impl != (BIGNUM *)0x0);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((BIGNUM *)local_20._M_head_impl == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,local_68,(AssertionResult *)(anon_var_dwarf_1adfbe + 0xc),"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x605,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
  }
  else {
    local_68[0] = (internal)((BIGNUM *)local_28._M_head_impl != (BIGNUM *)0x0);
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((BIGNUM *)local_28._M_head_impl == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,local_68,(AssertionResult *)0x56def3,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x606,local_50._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    }
    else {
      local_68[0] = (internal)((BIGNUM *)local_30._M_head_impl != (BIGNUM *)0x0);
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_68[0]) {
        BN_zero(local_30._M_head_impl);
        dv._M_head_impl = local_20._M_head_impl;
        _Var2._M_head_impl = local_28._M_head_impl;
        pBVar4 = BN_value_one();
        iVar3 = BN_div((BIGNUM *)dv._M_head_impl,(BIGNUM *)_Var2._M_head_impl,pBVar4,
                       (BIGNUM *)local_30._M_head_impl,
                       (BN_CTX *)
                       (this->super_BNTest).ctx_._M_t.
                       super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        local_68[0] = (internal)(iVar3 == 0);
        local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_68[0]) {
          testing::Message::Message((Message *)&local_70);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,local_68,
                     (AssertionResult *)
                     "BN_div(a.get(), b.get(), BN_value_one(), zero.get(), ctx())","true","false",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x60b,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((BN_MONT_CTX *)local_70._M_head_impl != (BN_MONT_CTX *)0x0) {
            (**(code **)(*(long *)local_70._M_head_impl + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        ERR_clear_error();
        _Var2._M_head_impl = local_20._M_head_impl;
        pBVar4 = BN_value_one();
        pBVar5 = BN_value_one();
        iVar3 = BN_mod_mul((BIGNUM *)_Var2._M_head_impl,pBVar4,pBVar5,
                           (BIGNUM *)local_30._M_head_impl,
                           (BN_CTX *)
                           (this->super_BNTest).ctx_._M_t.
                           super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        local_68[0] = (internal)(iVar3 == 0);
        local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_68[0]) {
          testing::Message::Message((Message *)&local_70);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,local_68,
                     (AssertionResult *)
                     "BN_mod_mul(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx())","true"
                     ,"false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x60f,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((BN_MONT_CTX *)local_70._M_head_impl != (BN_MONT_CTX *)0x0) {
            (**(code **)(*(long *)local_70._M_head_impl + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        ERR_clear_error();
        _Var2._M_head_impl = local_20._M_head_impl;
        pBVar4 = BN_value_one();
        pBVar5 = BN_value_one();
        iVar3 = BN_mod_exp((BIGNUM *)_Var2._M_head_impl,pBVar4,pBVar5,
                           (BIGNUM *)local_30._M_head_impl,
                           (BN_CTX *)
                           (this->super_BNTest).ctx_._M_t.
                           super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        local_68[0] = (internal)(iVar3 == 0);
        local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_68[0]) {
          testing::Message::Message((Message *)&local_70);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,local_68,
                     (AssertionResult *)
                     "BN_mod_exp(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx())","true"
                     ,"false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x613,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((BN_MONT_CTX *)local_70._M_head_impl != (BN_MONT_CTX *)0x0) {
            (**(code **)(*(long *)local_70._M_head_impl + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        ERR_clear_error();
        _Var2._M_head_impl = local_20._M_head_impl;
        pBVar4 = BN_value_one();
        pBVar5 = BN_value_one();
        pcVar7 = (char *)0x0;
        iVar3 = BN_mod_exp_mont((BIGNUM *)_Var2._M_head_impl,pBVar4,pBVar5,
                                (BIGNUM *)local_30._M_head_impl,
                                (BN_CTX *)
                                (this->super_BNTest).ctx_._M_t.
                                super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                                (BN_MONT_CTX *)0x0);
        local_68[0] = (internal)(iVar3 == 0);
        local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_68[0]) {
          testing::Message::Message((Message *)&local_70);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,local_68,
                     (AssertionResult *)
                     "BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx(), __null)"
                     ,"true","false",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x617,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((BN_MONT_CTX *)local_70._M_head_impl != (BN_MONT_CTX *)0x0) {
            (**(code **)(*(long *)local_70._M_head_impl + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        ERR_clear_error();
        _Var2._M_head_impl = local_20._M_head_impl;
        pBVar4 = BN_value_one();
        pBVar5 = BN_value_one();
        pcVar7 = (char *)0x0;
        iVar3 = BN_mod_exp_mont_consttime
                          ((BIGNUM *)_Var2._M_head_impl,pBVar4,pBVar5,
                           (BIGNUM *)local_30._M_head_impl,
                           (BN_CTX *)
                           (this->super_BNTest).ctx_._M_t.
                           super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                           (BN_MONT_CTX *)0x0);
        local_68[0] = (internal)(iVar3 == 0);
        local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_68[0]) {
          testing::Message::Message((Message *)&local_70);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,local_68,
                     (AssertionResult *)
                     "BN_mod_exp_mont_consttime( a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx(), nullptr)"
                     ,"true","false",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x61b,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((BN_MONT_CTX *)local_70._M_head_impl != (BN_MONT_CTX *)0x0) {
            (**(code **)(*(long *)local_70._M_head_impl + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        ERR_clear_error();
        local_70._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             BN_MONT_CTX_new_for_modulus
                       (local_30._M_head_impl,
                        (this->super_BNTest).ctx_._M_t.
                        super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        local_68[0] = (internal)((BN_MONT_CTX *)local_70._M_head_impl == (BN_MONT_CTX *)0x0);
        local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_68[0]) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,local_68,(AssertionResult *)0x5831e4,"true","false",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x620,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_78.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_78.data_ + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        ERR_clear_error();
        pBVar6 = (BN_MONT_CTX *)
                 BN_MONT_CTX_new_consttime
                           (local_28._M_head_impl,
                            (this->super_BNTest).ctx_._M_t.
                            super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        _Var1._M_head_impl = local_70._M_head_impl;
        bVar8 = (BN_MONT_CTX *)local_70._M_head_impl != (BN_MONT_CTX *)0x0;
        local_70._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pBVar6;
        if (bVar8) {
          BN_MONT_CTX_free((BN_MONT_CTX *)_Var1._M_head_impl);
        }
        local_68[0] = (internal)((BN_MONT_CTX *)local_70._M_head_impl == (BN_MONT_CTX *)0x0);
        local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_68[0]) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,local_68,(AssertionResult *)0x5831e4,"true","false",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x624,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_78.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_78.data_ + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        ERR_clear_error();
        iVar3 = BN_set_word((BIGNUM *)local_28._M_head_impl,0x10);
        local_68[0] = (internal)(iVar3 != 0);
        local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,local_68,(AssertionResult *)"BN_set_word(b.get(), 16)","false","true"
                     ,pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x628,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_78.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_78.data_ + 8))();
          }
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_60,local_60);
          }
        }
        else {
          pBVar6 = (BN_MONT_CTX *)
                   BN_MONT_CTX_new_for_modulus
                             (local_28._M_head_impl,
                              (this->super_BNTest).ctx_._M_t.
                              super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
          _Var1._M_head_impl = local_70._M_head_impl;
          bVar8 = (BN_MONT_CTX *)local_70._M_head_impl != (BN_MONT_CTX *)0x0;
          local_70._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pBVar6;
          if (bVar8) {
            BN_MONT_CTX_free((BN_MONT_CTX *)_Var1._M_head_impl);
          }
          local_68[0] = (internal)((BN_MONT_CTX *)local_70._M_head_impl == (BN_MONT_CTX *)0x0);
          local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_68[0]) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_50,local_68,(AssertionResult *)0x5831e4,"true","false",pcVar7);
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x62b,local_50._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if (local_78.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
          }
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_60,local_60);
          }
          ERR_clear_error();
          pBVar6 = (BN_MONT_CTX *)
                   BN_MONT_CTX_new_consttime
                             (local_28._M_head_impl,
                              (this->super_BNTest).ctx_._M_t.
                              super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
          _Var1._M_head_impl = local_70._M_head_impl;
          bVar8 = (BN_MONT_CTX *)local_70._M_head_impl != (BN_MONT_CTX *)0x0;
          local_70._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pBVar6;
          if (bVar8) {
            BN_MONT_CTX_free((BN_MONT_CTX *)_Var1._M_head_impl);
          }
          local_68[0] = (internal)((BN_MONT_CTX *)local_70._M_head_impl == (BN_MONT_CTX *)0x0);
          local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_68[0]) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_50,local_68,(AssertionResult *)0x5831e4,"true","false",pcVar7);
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x62f,local_50._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if (local_78.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
          }
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_60,local_60);
          }
          ERR_clear_error();
          _Var2._M_head_impl = local_20._M_head_impl;
          pBVar4 = BN_value_one();
          pBVar5 = BN_value_one();
          pcVar7 = (char *)0x0;
          iVar3 = BN_mod_exp_mont((BIGNUM *)_Var2._M_head_impl,pBVar4,pBVar5,
                                  (BIGNUM *)local_28._M_head_impl,
                                  (BN_CTX *)
                                  (this->super_BNTest).ctx_._M_t.
                                  super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                                  (BN_MONT_CTX *)0x0);
          local_68[0] = (internal)(iVar3 == 0);
          local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_68[0]) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_50,local_68,
                       (AssertionResult *)
                       "BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(), b.get(), ctx(), __null)"
                       ,"true","false",pcVar7);
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x633,local_50._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if (local_78.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
          }
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_60,local_60);
          }
          ERR_clear_error();
          _Var2._M_head_impl = local_20._M_head_impl;
          pBVar4 = BN_value_one();
          pBVar5 = BN_value_one();
          pcVar7 = (char *)0x0;
          iVar3 = BN_mod_exp_mont_consttime
                            ((BIGNUM *)_Var2._M_head_impl,pBVar4,pBVar5,
                             (BIGNUM *)local_28._M_head_impl,
                             (BN_CTX *)
                             (this->super_BNTest).ctx_._M_t.
                             super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                             (BN_MONT_CTX *)0x0);
          local_68[0] = (internal)(iVar3 == 0);
          local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_68[0]) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_50,local_68,
                       (AssertionResult *)
                       "BN_mod_exp_mont_consttime( a.get(), BN_value_one(), BN_value_one(), b.get(), ctx(), nullptr)"
                       ,"true","false",pcVar7);
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x637,local_50._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if (local_78.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
          }
          if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_60,local_60);
          }
          ERR_clear_error();
        }
        std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&local_70);
        goto LAB_002c2a09;
      }
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,local_68,(AssertionResult *)0x5340f6,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x607,local_50._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((BN_MONT_CTX *)local_70._M_head_impl != (BN_MONT_CTX *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
LAB_002c2a09:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_30);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_28);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_20);
  return;
}

Assistant:

TEST_F(BNTest, BadModulus) {
  bssl::UniquePtr<BIGNUM> a(BN_new());
  bssl::UniquePtr<BIGNUM> b(BN_new());
  bssl::UniquePtr<BIGNUM> zero(BN_new());
  ASSERT_TRUE(a);
  ASSERT_TRUE(b);
  ASSERT_TRUE(zero);

  BN_zero(zero.get());

  EXPECT_FALSE(BN_div(a.get(), b.get(), BN_value_one(), zero.get(), ctx()));
  ERR_clear_error();

  EXPECT_FALSE(
      BN_mod_mul(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx()));
  ERR_clear_error();

  EXPECT_FALSE(
      BN_mod_exp(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx()));
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(),
                               zero.get(), ctx(), NULL));
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont_consttime(
      a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx(), nullptr));
  ERR_clear_error();

  bssl::UniquePtr<BN_MONT_CTX> mont(
      BN_MONT_CTX_new_for_modulus(zero.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  mont.reset(BN_MONT_CTX_new_consttime(b.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  // Some operations also may not be used with an even modulus.
  ASSERT_TRUE(BN_set_word(b.get(), 16));

  mont.reset(BN_MONT_CTX_new_for_modulus(b.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  mont.reset(BN_MONT_CTX_new_consttime(b.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(), b.get(),
                               ctx(), NULL));
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont_consttime(
      a.get(), BN_value_one(), BN_value_one(), b.get(), ctx(), nullptr));
  ERR_clear_error();
}